

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketPipeEnd::pumpTo(WebSocketPipeEnd *this,WebSocket *other)

{
  WebSocket *other_00;
  _func_int *p_Var1;
  void *pvVar2;
  _func_int **in_RDX;
  AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:4491:41)>_>
  *location;
  undefined1 local_60 [16];
  Fault f;
  DebugComparison<kj::Maybe<kj::WebSocket_&>_&,_const_kj::None_&> _kjCondition;
  
  other_00 = (WebSocket *)other[2]._vptr_WebSocket;
  _kjCondition.left = (Maybe<kj::WebSocket_&> *)(other_00 + 3);
  _kjCondition.result = other_00[3]._vptr_WebSocket == (_func_int **)0x0;
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    other_00[3]._vptr_WebSocket = in_RDX;
    WebSocketPipeImpl::pumpTo((WebSocketPipeImpl *)local_60,other_00);
    _kjCondition.left = (Maybe<kj::WebSocket_&> *)CONCAT71(_kjCondition.left._1_7_,1);
    p_Var1 = *(_func_int **)(local_60._0_8_ + 8);
    _kjCondition.right = (None *)other;
    if (p_Var1 == (_func_int *)0x0 || (ulong)(local_60._0_8_ - (long)p_Var1) < 0x28) {
      pvVar2 = operator_new(0x400);
      location = (AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:4491:41)>_>
                  *)((long)pvVar2 + 0x3d8);
      ctor<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::(anonymous_namespace)::WebSocketPipeEnd::pumpTo(kj::WebSocket&)::_lambda()_1_>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::Deferred<kj::(anonymous_namespace)::WebSocketPipeEnd::pumpTo(kj::WebSocket&)::_lambda()_1_>>
                (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_60,
                 (Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:4491:41)>
                  *)&_kjCondition);
      *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
    }
    else {
      *(_func_int **)(local_60._0_8_ + 8) = (_func_int *)0x0;
      location = (AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:4491:41)>_>
                  *)(local_60._0_8_ + -0x28);
      ctor<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::(anonymous_namespace)::WebSocketPipeEnd::pumpTo(kj::WebSocket&)::_lambda()_1_>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::Deferred<kj::(anonymous_namespace)::WebSocketPipeEnd::pumpTo(kj::WebSocket&)::_lambda()_1_>>
                (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_60,
                 (Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:4491:41)>
                  *)&_kjCondition);
      *(_func_int **)(local_60._0_8_ + -0x20) = p_Var1;
    }
    local_60._8_8_ = (_func_int **)0x0;
    (this->super_WebSocket)._vptr_WebSocket = (_func_int **)location;
    f.exception = (Exception *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
    Own<kj::_::AttachmentPromiseNode<kj::_::Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:4491:41)>_>,_kj::_::PromiseDisposer>
    ::~Own((Own<kj::_::AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:4491:41)>_>,_kj::_::PromiseDisposer>
            *)(local_60 + 8));
    if ((char)_kjCondition.left == '\x01') {
      *(undefined8 *)(*(long *)(_kjCondition.right + 0x10) + 0x18) = 0;
    }
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_60);
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::WebSocket&>&,kj::None_const&>&,char_const(&)[38]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1188,FAILED,"in->destinationPumpingTo == kj::none",
             "_kjCondition,\"can only call pumpTo() once at a time\"",&_kjCondition,
             (char (*) [38])"can only call pumpTo() once at a time");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
    KJ_REQUIRE(in->destinationPumpingTo == kj::none, "can only call pumpTo() once at a time");
    // By convention, we store the WebSocket reference on `in`.
    in->destinationPumpingTo = other;
    auto deferredUnregister = kj::defer([this]() { in->destinationPumpingTo = kj::none; });
    return in->pumpTo(other).attach(kj::mv(deferredUnregister));
  }